

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::DefineOwnPropertyForArray
               (JavascriptArray *arr,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  BOOL BVar5;
  uint uVar6;
  uint64 uVar7;
  uint64 uVar8;
  undefined4 *puVar9;
  PropertyRecord *pPVar10;
  int32 errorCode;
  Var value;
  double value_00;
  undefined1 local_98 [8];
  PropertyDescriptor newWritableDesc;
  uint32 index;
  char local_48;
  
  if (propId == 0xd1) {
    if (descriptor->valueSpecified == false) {
      BVar5 = DefineOwnPropertyDescriptor
                        ((RecyclableObject *)arr,0xd1,descriptor,throwOnError,scriptContext,
                         PropertyOperation_None);
      return BVar5;
    }
    PropertyDescriptor::PropertyDescriptor
              ((PropertyDescriptor *)&newWritableDesc.Configurable,descriptor);
    uVar3 = ES5Array::ToLengthValue((descriptor->Value).ptr,scriptContext);
    if ((int)uVar3 < 0) {
      value_00 = (double)uVar3;
      uVar7 = NumberUtilities::ToSpecial(value_00);
      bVar2 = NumberUtilities::IsNan(value_00);
      if (((bVar2) && (uVar8 = NumberUtilities::ToSpecial(value_00), uVar8 != 0xfff8000000000000))
         && (uVar8 = NumberUtilities::ToSpecial(value_00), uVar8 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar9 = 0;
      }
      value = (Var)(uVar7 ^ 0xfffc000000000000);
    }
    else {
      value = (Var)((ulong)uVar3 | 0x1000000000000);
    }
    PropertyDescriptor::SetValue((PropertyDescriptor *)&newWritableDesc.Configurable,value);
    if (uVar3 < (arr->super_ArrayObject).length) {
      iVar4 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x30])(arr,0xd1);
      if (iVar4 == 0) {
        errorCode = -0x7ff5ec29;
      }
      else {
        if ((local_48 != '\x01') ||
           (bVar2 = PropertyDescriptor::IsWritable
                              ((PropertyDescriptor *)&newWritableDesc.Configurable), bVar2)) {
          BVar5 = DefineOwnPropertyDescriptor
                            ((RecyclableObject *)arr,0xd1,
                             (PropertyDescriptor *)&newWritableDesc.Configurable,throwOnError,
                             scriptContext,PropertyOperation_None);
          if (BVar5 == 0) {
            return 0;
          }
        }
        else {
          PropertyDescriptor::SetWritable((PropertyDescriptor *)&newWritableDesc.Configurable,true);
          BVar5 = DefineOwnPropertyDescriptor
                            ((RecyclableObject *)arr,0xd1,
                             (PropertyDescriptor *)&newWritableDesc.Configurable,throwOnError,
                             scriptContext,PropertyOperation_None);
          if (BVar5 == 0) {
            return 0;
          }
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
          PropertyDescriptor::SetWritable((PropertyDescriptor *)local_98,false);
          DefineOwnPropertyDescriptor
                    ((RecyclableObject *)arr,0xd1,(PropertyDescriptor *)local_98,false,scriptContext
                     ,PropertyOperation_None);
        }
        if ((arr->super_ArrayObject).length <= uVar3) {
          return 1;
        }
        errorCode = -0x7ff5ec27;
      }
      Reject(throwOnError,scriptContext,errorCode,0xd1);
      return 0;
    }
    descriptor = (PropertyDescriptor *)&newWritableDesc.Configurable;
    propId = 0xd1;
  }
  else {
    BVar5 = ScriptContext::IsNumericPropertyId
                      (scriptContext,propId,(uint32 *)&newWritableDesc.Configurable);
    if (BVar5 != 0) {
      if (((arr->super_ArrayObject).length <= (uint)newWritableDesc._40_4_) &&
         (iVar4 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x30])(arr,0xd1), iVar4 == 0)) {
        if (!throwOnError) {
          return 0;
        }
        pPVar10 = ThreadContext::GetPropertyName(scriptContext->threadContext,propId);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec28,(PCWSTR)(pPVar10 + 1));
      }
      BVar5 = DefineOwnPropertyDescriptor
                        ((RecyclableObject *)arr,propId,descriptor,false,scriptContext,
                         PropertyOperation_None);
      if (BVar5 != 0 || !throwOnError) {
        return (uint)(BVar5 != 0);
      }
      pPVar10 = ThreadContext::GetPropertyName(scriptContext->threadContext,propId);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec27,(PCWSTR)(pPVar10 + 1));
    }
  }
  uVar6 = DefineOwnPropertyDescriptor
                    ((RecyclableObject *)arr,propId,descriptor,throwOnError,scriptContext,
                     PropertyOperation_None);
  return uVar6;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyForArray(JavascriptArray* arr, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext)
    {
        if (propId == PropertyIds::length)
        {
            if (!descriptor.ValueSpecified())
            {
                return DefineOwnPropertyDescriptor(arr, PropertyIds::length, descriptor, throwOnError, scriptContext);
            }

            PropertyDescriptor newLenDesc = descriptor;
            uint32 newLen = ES5Array::ToLengthValue(descriptor.GetValue(), scriptContext);
            newLenDesc.SetValue(JavascriptNumber::ToVar(newLen, scriptContext));

            uint32 oldLen = arr->GetLength();
            if (newLen >= oldLen)
            {
                return DefineOwnPropertyDescriptor(arr, PropertyIds::length, newLenDesc, throwOnError, scriptContext);
            }

            BOOL oldLenWritable = arr->IsWritable(PropertyIds::length);
            if (!oldLenWritable)
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_NotWritable, propId);
            }

            bool newWritable = (!newLenDesc.WritableSpecified() || newLenDesc.IsWritable());
            if (!newWritable)
            {
                // Need to defer setting writable to false in case any elements cannot be deleted
                newLenDesc.SetWritable(true);
            }

            BOOL succeeded = DefineOwnPropertyDescriptor(arr, PropertyIds::length, newLenDesc, throwOnError, scriptContext);
            //
            // Our SetProperty(length) is also responsible to trim elements. When succeeded is
            //
            //  false:
            //      * length attributes rejected
            //      * elements not touched
            //  true:
            //      * length attributes are set successfully
            //      * elements trimming may be either completed or incompleted, length value is correct
            //
            //      * Strict mode TODO: Currently SetProperty(length) does not throw. If that throws, we need
            //        to update here to set correct newWritable even on exception.
            //
            if (!succeeded)
            {
                return false;
            }

            if (!newWritable) // Now set requested newWritable.
            {
                PropertyDescriptor newWritableDesc;
                newWritableDesc.SetWritable(false);
                DefineOwnPropertyDescriptor(arr, PropertyIds::length, newWritableDesc, false, scriptContext);
            }

            if (arr->GetLength() > newLen) // Delete incompleted
            {
                // Since SetProperty(length) not throwing, we'll reject here
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_Default, propId);
            }

            return true;
        }

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propId, &index))
        {
            if (index >= arr->GetLength() && !arr->IsWritable(PropertyIds::length))
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_LengthNotWritable, propId);
            }

            BOOL succeeded = DefineOwnPropertyDescriptor(arr, propId, descriptor, false, scriptContext);
            if (!succeeded)
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_Default, propId);
            }

            // Out SetItem takes care of growing "length". we are done.
            return true;
        }

        return DefineOwnPropertyDescriptor(arr, propId, descriptor, throwOnError, scriptContext);
    }